

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEBody.cpp
# Opt level: O0

bool __thiscall test_CEBody::test_Name(test_CEBody *this)

{
  byte bVar1;
  long *in_RDI;
  string new_name;
  CEBody test_body;
  CEBody *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  string *in_stack_fffffffffffffe60;
  allocator *paVar2;
  CEBody *other;
  CEBody *this_00;
  undefined4 local_170;
  allocator local_169;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  undefined1 local_f9 [113];
  undefined4 local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  CEBody::Name_abi_cxx11_(in_stack_fffffffffffffe48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Crab",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"test_Name",&local_81);
  local_88 = 0x6c;
  (**(code **)(*in_RDI + 0x70))(in_RDI,local_28,local_48,local_80,&local_88);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::~string(local_28);
  other = (CEBody *)(in_RDI + 0x44);
  this_00 = (CEBody *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"",(allocator *)this_00);
  CEBody::CEBody(this_00,other,in_stack_fffffffffffffe60);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  paVar2 = &local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"NotCrab",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  CEBody::SetName((CEBody *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                  (string *)in_stack_fffffffffffffe48);
  CEBody::Name_abi_cxx11_(in_stack_fffffffffffffe48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"test_Name",&local_169);
  local_170 = 0x72;
  (**(code **)(*in_RDI + 0x70))(in_RDI,local_148,local_120,local_168,&local_170);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_148);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  std::__cxx11::string::~string(local_120);
  CEBody::~CEBody((CEBody *)CONCAT17(bVar1,in_stack_fffffffffffffe50));
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEBody::test_Name(void)
{
    // Check that we can get the name
    test_string(base_.Name(), "Crab", __func__, __LINE__);

    // Check that we can set the name
    CEBody test_body(base_);
    std::string new_name = "NotCrab";
    test_body.SetName(new_name);
    test_string(test_body.Name(), new_name, __func__, __LINE__);

    return pass();
}